

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerRestParameter
          (Lowerer *this,Opnd *formalsOpnd,Opnd *dstOpnd,Opnd *excessOpnd,Instr *instr,
          RegOpnd *generatorArgsPtrOpnd)

{
  bool bVar1;
  ushort uVar2;
  Instr *instr_00;
  JITTimeFunctionBody *this_00;
  RegOpnd *dst;
  IntConstOpnd *pIVar3;
  long lVar4;
  RegOpnd *argPtrOpnd;
  uint16 actualOffset;
  RegOpnd *srcOpnd;
  BOOL isGenerator;
  JnHelperMethod helperMethod;
  Instr *helperCallInstr;
  RegOpnd *generatorArgsPtrOpnd_local;
  Instr *instr_local;
  Opnd *excessOpnd_local;
  Opnd *dstOpnd_local;
  Opnd *formalsOpnd_local;
  Lowerer *this_local;
  
  instr_00 = IR::Instr::New(CALL,dstOpnd,instr->m_func);
  IR::Instr::InsertAfter(instr,instr_00);
  LoadScriptContext(this,instr_00);
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar1 = JITTimeFunctionBody::IsCoroutine(this_00);
  if (bVar1) {
    uVar2 = 0;
  }
  else {
    generatorArgsPtrOpnd = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    uVar2 = GetFormalParamOffset();
  }
  dst = IR::RegOpnd::New(TyUint64,this->m_func);
  pIVar3 = IR::Opnd::AsIntConstOpnd(formalsOpnd);
  lVar4 = IR::EncodableOpnd<long>::GetValue(&pIVar3->super_EncodableOpnd<long>);
  pIVar3 = IR::IntConstOpnd::New((lVar4 + (ulong)uVar2) * 8,TyUint64,this->m_func,false);
  InsertAdd(false,&dst->super_Opnd,&generatorArgsPtrOpnd->super_Opnd,&pIVar3->super_Opnd,instr_00);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr_00,&dst->super_Opnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr_00,excessOpnd);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr_00,HelperScrArr_OP_NewScArrayWithElements,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return instr_00;
}

Assistant:

IR::Instr *Lowerer::LowerRestParameter(IR::Opnd *formalsOpnd, IR::Opnd *dstOpnd, IR::Opnd *excessOpnd, IR::Instr *instr, IR::RegOpnd *generatorArgsPtrOpnd)
{
    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, dstOpnd, instr->m_func);
    instr->InsertAfter(helperCallInstr);

    // Var JavascriptArray::OP_NewScArrayWithElements(
    //        int32 elementCount,
    //        Var *elements,
    //        ScriptContext* scriptContext)
    IR::JnHelperMethod helperMethod = IR::HelperScrArr_OP_NewScArrayWithElements;

    LoadScriptContext(helperCallInstr);

    BOOL isGenerator = this->m_func->GetJITFunctionBody()->IsCoroutine();

    // Elements pointer = ebp + (formals count + formals offset + 1)*sizeof(Var)
    IR::RegOpnd *srcOpnd = isGenerator ? generatorArgsPtrOpnd : IR::Opnd::CreateFramePointerOpnd(this->m_func);
    uint16 actualOffset = isGenerator ? 0 : GetFormalParamOffset(); //4
    IR::RegOpnd *argPtrOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    InsertAdd(false, argPtrOpnd, srcOpnd, IR::IntConstOpnd::New((formalsOpnd->AsIntConstOpnd()->GetValue() + actualOffset) * MachPtr, TyMachPtr, this->m_func), helperCallInstr);
    m_lowererMD.LoadHelperArgument(helperCallInstr, argPtrOpnd);

    m_lowererMD.LoadHelperArgument(helperCallInstr, excessOpnd);
    m_lowererMD.ChangeToHelperCall(helperCallInstr, helperMethod);

    return helperCallInstr;
}